

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O3

void __thiscall soplex::CLUFactorRational::eliminateColSingletons(CLUFactorRational *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  Pring *pPVar7;
  int *piVar8;
  Pring *pPVar9;
  pointer pnVar10;
  int *piVar11;
  Pring *pPVar12;
  Pring *pPVar13;
  Pring *pPVar14;
  int *piVar15;
  int iVar16;
  long lVar17;
  int *piVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int *piVar22;
  
  pPVar12 = (this->temp).pivot_colNZ;
  pPVar13 = pPVar12[1].prev;
  pPVar14 = pPVar12 + 1;
  if (pPVar13 != pPVar14) {
    piVar15 = (this->u).row.start;
    do {
      iVar1 = pPVar13->idx;
      piVar4 = (this->u).col.len;
      iVar2 = piVar4[iVar1];
      piVar4[iVar1] = iVar2 + -1;
      piVar5 = (this->u).col.idx;
      piVar6 = (this->u).col.start;
      iVar2 = piVar5[(long)piVar6[iVar1] + -1 + (long)iVar2];
      pPVar14 = (this->temp).pivot_row;
      pPVar7 = pPVar14[iVar2].next;
      pPVar14 = pPVar14[iVar2].prev;
      pPVar7->prev = pPVar14;
      pPVar14->next = pPVar7;
      piVar8 = (this->u).row.len;
      iVar16 = piVar8[iVar2];
      piVar8[iVar2] = iVar16 + -1;
      lVar21 = (long)piVar15[iVar2] + -1 + (long)iVar16;
      piVar15 = (this->u).row.idx;
      iVar16 = piVar15[lVar21];
      iVar19 = (int)lVar21;
      lVar17 = lVar21;
      if (iVar16 != iVar1) {
        piVar8 = (this->temp).s_cact;
        pPVar14 = (this->temp).pivot_col;
        do {
          iVar19 = piVar6[iVar16];
          iVar3 = piVar4[iVar16];
          iVar20 = piVar8[iVar16];
          piVar8[iVar16] = iVar20 + -1;
          iVar20 = (iVar19 + iVar3) - iVar20;
          piVar11 = piVar5 + iVar20;
          do {
            piVar22 = piVar11;
            piVar11 = piVar22 + 1;
          } while (*piVar22 != iVar2);
          *piVar22 = piVar5[iVar20];
          piVar5[iVar20] = iVar2;
          iVar19 = piVar8[iVar16];
          pPVar7 = pPVar14[iVar16].next;
          pPVar9 = pPVar14[iVar16].prev;
          pPVar7->prev = pPVar9;
          pPVar9->next = pPVar7;
          pPVar7 = pPVar12[iVar19].next;
          pPVar14[iVar16].next = pPVar7;
          pPVar7->prev = pPVar14 + iVar16;
          pPVar14[iVar16].prev = pPVar12 + iVar19;
          pPVar12[iVar19].next = pPVar14 + iVar16;
          iVar16 = piVar15[lVar17 + -1];
          lVar17 = lVar17 + -1;
        } while (iVar16 != iVar1);
        iVar19 = (int)lVar17;
      }
      iVar16 = (this->temp).stage;
      (this->temp).stage = iVar16 + 1;
      setPivot(this,iVar16,iVar1,iVar2,
               (this->u).row.val.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar17);
      piVar15 = (this->u).row.idx;
      piVar15[lVar17] = piVar15[lVar21];
      pnVar10 = (this->u).row.val.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)(pnVar10 + lVar17),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)(pnVar10 + lVar21));
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&pnVar10[lVar17].m_backend.m_value + 0x20),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&pnVar10[lVar21].m_backend.m_value + 0x20));
      piVar15 = (this->u).row.start;
      pPVar12 = (this->temp).pivot_colNZ;
      iVar1 = piVar15[iVar2];
      if (iVar1 < iVar19) {
        piVar4 = (this->u).row.idx;
        piVar5 = (this->u).col.idx;
        piVar6 = (this->u).col.len;
        piVar8 = (this->u).col.start;
        piVar11 = (this->temp).s_cact;
        pPVar14 = (this->temp).pivot_col;
        lVar21 = (long)iVar19;
        do {
          iVar16 = piVar4[lVar21 + -1];
          lVar21 = lVar21 + -1;
          iVar19 = piVar8[iVar16];
          iVar3 = piVar6[iVar16];
          iVar20 = piVar11[iVar16];
          piVar11[iVar16] = iVar20 + -1;
          iVar20 = (iVar19 + iVar3) - iVar20;
          piVar22 = piVar5 + iVar20;
          do {
            piVar18 = piVar22;
            piVar22 = piVar18 + 1;
          } while (*piVar18 != iVar2);
          *piVar18 = piVar5[iVar20];
          piVar5[iVar20] = iVar2;
          iVar19 = piVar11[iVar16];
          pPVar7 = pPVar14[iVar16].next;
          pPVar9 = pPVar14[iVar16].prev;
          pPVar7->prev = pPVar9;
          pPVar9->next = pPVar7;
          pPVar7 = pPVar12[iVar19].next;
          pPVar14[iVar16].next = pPVar7;
          pPVar7->prev = pPVar14 + iVar16;
          pPVar14[iVar16].prev = pPVar12 + iVar19;
          pPVar12[iVar19].next = pPVar14 + iVar16;
        } while (iVar1 < lVar21);
      }
      pPVar13 = pPVar13->prev;
      pPVar14 = pPVar12 + 1;
    } while (pPVar13 != pPVar14);
  }
  pPVar12[1].next = pPVar12 + 1;
  pPVar12[1].prev = pPVar14;
  return;
}

Assistant:

inline void CLUFactorRational::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactorRational::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}